

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O3

void Gia_QbfPrint(Qbf_Man_t *p,Vec_Int_t *vValues,int Iter)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int level;
  long lVar4;
  timespec ts;
  timespec local_30;
  
  printf("%5d : ",(ulong)(uint)Iter);
  if (vValues->nSize == p->nVars) {
    if (0 < vValues->nSize) {
      lVar4 = 0;
      do {
        printf("%d",(ulong)(vValues->pArray[lVar4] != 0));
        lVar4 = lVar4 + 1;
      } while (lVar4 < vValues->nSize);
    }
    printf("  ");
    if (p->pSatSynG == (bmcg_sat_solver *)0x0) {
      uVar2 = sat_solver_nvars(p->pSatSyn);
    }
    else {
      uVar2 = bmcg_sat_solver_varnum(p->pSatSynG);
    }
    printf("Var =%7d  ",(ulong)uVar2);
    if (p->pSatSynG == (bmcg_sat_solver *)0x0) {
      uVar2 = sat_solver_nclauses(p->pSatSyn);
    }
    else {
      uVar2 = bmcg_sat_solver_clausenum(p->pSatSynG);
    }
    printf("Cla =%7d  ",(ulong)uVar2);
    if (p->pSatSynG == (bmcg_sat_solver *)0x0) {
      uVar2 = sat_solver_nconflicts(p->pSatSyn);
    }
    else {
      uVar2 = bmcg_sat_solver_conflictnum(p->pSatSynG);
    }
    printf("Conf =%9d  ",(ulong)uVar2);
    level = 3;
    iVar3 = clock_gettime(3,&local_30);
    if (iVar3 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    lVar1 = p->clkStart;
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar4 - lVar1) / 1000000.0);
    return;
  }
  __assert_fail("Vec_IntSize(vValues) == p->nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaQbf.c"
                ,0x219,"void Gia_QbfPrint(Qbf_Man_t *, Vec_Int_t *, int)");
}

Assistant:

void Gia_QbfPrint( Qbf_Man_t * p, Vec_Int_t * vValues, int Iter )
{
    printf( "%5d : ", Iter );
    assert( Vec_IntSize(vValues) == p->nVars );
    Vec_IntPrintBinary( vValues ); printf( "  " );
    printf( "Var =%7d  ",  p->pSatSynG ? bmcg_sat_solver_varnum(p->pSatSynG)      : sat_solver_nvars(p->pSatSyn)      );
    printf( "Cla =%7d  ",  p->pSatSynG ? bmcg_sat_solver_clausenum(p->pSatSynG)   : sat_solver_nclauses(p->pSatSyn)   );
    printf( "Conf =%9d  ", p->pSatSynG ? bmcg_sat_solver_conflictnum(p->pSatSynG) : sat_solver_nconflicts(p->pSatSyn) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
}